

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O3

TestCaseGroup * vkt::image::createImageFormatReinterpretTests(TestContext *testCtx)

{
  size_type *psVar1;
  VkFormat format;
  VkFormat format_00;
  int iVar2;
  int iVar3;
  TextureFormat *pTVar4;
  undefined8 *puVar5;
  TestNode *node;
  TextureFormat TVar6;
  long lVar7;
  ImageType imageType;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  undefined8 *extraout_RDX_01;
  undefined8 *extraout_RDX_02;
  undefined8 *extraout_RDX_03;
  undefined8 *extraout_RDX_04;
  undefined8 *extraout_RDX_05;
  undefined8 *extraout_RDX_06;
  undefined8 *puVar8;
  undefined8 *extraout_RDX_07;
  long lVar9;
  ulong uVar10;
  undefined8 uVar11;
  string caseName;
  string local_e8;
  TestNode *local_c8;
  TextureFormat local_c0;
  TextureFormat local_b8;
  ulong local_b0;
  TextureFormat TStack_a8;
  TestNode *local_a0;
  TestContext *local_98;
  long local_90;
  string local_88;
  string local_68;
  long local_48;
  long local_40;
  undefined8 *local_38;
  
  local_a0 = (TestNode *)operator_new(0x70);
  local_98 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_a0,testCtx,"format_reinterpret",
             "Cases with differing texture and image formats");
  lVar7 = 0;
  do {
    local_c8 = (TestNode *)operator_new(0x70);
    getImageTypeName_abi_cxx11_
              (&local_e8,(image *)(ulong)*(uint *)(&DAT_00d40a2c + lVar7 * 3),imageType);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_c8,local_98,local_e8._M_dataplus._M_p,"");
    puVar8 = extraout_RDX;
    local_48 = lVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      puVar8 = extraout_RDX_00;
    }
    local_38 = &(anonymous_namespace)::s_textures + lVar7 * 3;
    local_90 = 0;
    lVar7 = 0;
    do {
      format = (&(anonymous_namespace)::s_formats)[lVar7];
      lVar9 = 0;
      local_40 = lVar7;
      do {
        getFormatShortString_abi_cxx11_(&local_68,(image *)(ulong)format,(VkFormat)puVar8);
        pTVar4 = (TextureFormat *)std::__cxx11::string::append((char *)&local_68);
        TVar6 = (TextureFormat)(pTVar4 + 2);
        if (*pTVar4 == TVar6) {
          local_b0 = *(ulong *)TVar6;
          TStack_a8 = pTVar4[3];
          local_c0 = (TextureFormat)&local_b0;
        }
        else {
          local_b0 = *(ulong *)TVar6;
          local_c0 = *pTVar4;
        }
        local_b8 = pTVar4[1];
        *pTVar4 = TVar6;
        pTVar4[1].order = R;
        pTVar4[1].type = SNORM_INT8;
        *(undefined1 *)&pTVar4[2].order = R;
        format_00 = *(VkFormat *)((long)&(anonymous_namespace)::s_formats + lVar9);
        getFormatShortString_abi_cxx11_(&local_88,(image *)(ulong)format_00,local_b8.order);
        uVar10 = 0xf;
        if (local_c0 != (TextureFormat)&local_b0) {
          uVar10 = local_b0;
        }
        if (uVar10 < local_88._M_string_length + (long)local_b8) {
          uVar11 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            uVar11 = local_88.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar11 < local_88._M_string_length + (long)local_b8) goto LAB_006fe43b;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_c0);
        }
        else {
LAB_006fe43b:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_c0,(ulong)local_88._M_dataplus._M_p);
        }
        psVar1 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_e8.field_2._M_allocated_capacity = *psVar1;
          local_e8.field_2._8_8_ = puVar5[3];
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        }
        else {
          local_e8.field_2._M_allocated_capacity = *psVar1;
          local_e8._M_dataplus._M_p = (pointer)*puVar5;
        }
        puVar8 = puVar5 + 1;
        local_e8._M_string_length = puVar5[1];
        *puVar5 = psVar1;
        *puVar8 = 0;
        *(undefined1 *)psVar1 = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          puVar8 = extraout_RDX_01;
        }
        if (local_c0 != (TextureFormat)&local_b0) {
          operator_delete((void *)local_c0,local_b0 + 1);
          puVar8 = extraout_RDX_02;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          puVar8 = extraout_RDX_03;
        }
        if (local_90 != lVar9) {
          if (format != format_00) {
            local_c0 = ::vk::mapVkFormat(format);
            iVar2 = tcu::TextureFormat::getPixelSize(&local_c0);
            local_68._M_dataplus._M_p = (pointer)::vk::mapVkFormat(format_00);
            iVar3 = tcu::TextureFormat::getPixelSize((TextureFormat *)&local_68);
            puVar8 = extraout_RDX_04;
            if (iVar2 != iVar3) goto LAB_006fe602;
          }
          node = (TestNode *)operator_new(0x98);
          local_c0 = (TextureFormat)&local_b0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
          tcu::TestCase::TestCase
                    ((TestCase *)node,local_98,local_e8._M_dataplus._M_p,(char *)local_c0);
          node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cfe1c8;
          node[1]._vptr_TestNode = (_func_int **)*local_38;
          *(undefined4 *)&node[1].m_testCtx = *(undefined4 *)(local_38 + 1);
          *(undefined8 *)((long)&node[1].m_testCtx + 4) = *(undefined8 *)((long)local_38 + 0xc);
          *(undefined4 *)((long)&node[1].m_name._M_dataplus._M_p + 4) =
               *(undefined4 *)((long)local_38 + 0x14);
          *(VkFormat *)&node[1].m_name._M_string_length = format_00;
          *(VkFormat *)((long)&node[1].m_name._M_string_length + 4) = format;
          *(undefined2 *)&node[1].m_name.field_2 = 1;
          node[1].m_name.field_2._M_local_buf[2] = '\0';
          tcu::TestNode::addChild(local_c8,node);
          puVar8 = extraout_RDX_05;
          if (local_c0 != (TextureFormat)&local_b0) {
            operator_delete((void *)local_c0,local_b0 + 1);
            puVar8 = extraout_RDX_06;
          }
        }
LAB_006fe602:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          puVar8 = extraout_RDX_07;
        }
        lVar9 = lVar9 + 4;
      } while (lVar9 != 0x34);
      lVar7 = local_40 + 1;
      local_90 = local_90 + 4;
    } while (lVar7 != 0xd);
    tcu::TestNode::addChild(local_a0,local_c8);
    lVar7 = local_48 + 1;
    if (lVar7 == 8) {
      return (TestCaseGroup *)local_a0;
    }
  } while( true );
}

Assistant:

tcu::TestCaseGroup* createImageFormatReinterpretTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "format_reinterpret",	"Cases with differing texture and image formats"));

	for (int textureNdx = 0; textureNdx < DE_LENGTH_OF_ARRAY(s_textures); ++textureNdx)
	{
		const Texture& texture = s_textures[textureNdx];
		de::MovePtr<tcu::TestCaseGroup> groupByImageViewType (new tcu::TestCaseGroup(testCtx, getImageTypeName(texture.type()).c_str(), ""));

		for (int imageFormatNdx = 0; imageFormatNdx < DE_LENGTH_OF_ARRAY(s_formats); ++imageFormatNdx)
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(s_formats); ++formatNdx)
		{
			const std::string caseName = getFormatShortString(s_formats[imageFormatNdx]) + "_" + getFormatShortString(s_formats[formatNdx]);
			if (imageFormatNdx != formatNdx && formatsAreCompatible(s_formats[imageFormatNdx], s_formats[formatNdx]))
				groupByImageViewType->addChild(new LoadStoreTest(testCtx, caseName, "", texture, s_formats[formatNdx], s_formats[imageFormatNdx]));
		}
		testGroup->addChild(groupByImageViewType.release());
	}

	return testGroup.release();
}